

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_inet.c
# Opt level: O0

ngx_int_t ngx_parse_addr_port(ngx_pool_t *pool,ngx_addr_t *addr,u_char *text,size_t len)

{
  u_char *last_00;
  u_char *puVar1;
  size_t n;
  ngx_int_t nVar2;
  ngx_int_t port;
  ngx_int_t rc;
  size_t plen;
  u_char *last;
  u_char *p;
  size_t len_local;
  u_char *text_local;
  ngx_addr_t *addr_local;
  ngx_pool_t *pool_local;
  
  pool_local = (ngx_pool_t *)ngx_parse_addr(pool,addr,text,len);
  if (pool_local == (ngx_pool_t *)0xfffffffffffffffb) {
    last_00 = text + len;
    if ((len == 0) || (*text != '[')) {
      last = ngx_strlchr(text,last_00,':');
      p = (u_char *)len;
      len_local = (size_t)text;
      if (last == (u_char *)0x0) {
        return -5;
      }
    }
    else {
      puVar1 = ngx_strlchr(text,last_00,']');
      if (((puVar1 == (u_char *)0x0) || (puVar1 == last_00 + -1)) ||
         (last = puVar1 + 1, puVar1[1] != ':')) {
        return -5;
      }
      len_local = (size_t)(text + 1);
      p = (u_char *)(len - 2);
    }
    n = (long)last_00 - (long)(last + 1);
    nVar2 = ngx_atoi(last + 1,n);
    if ((nVar2 < 1) || (0xffff < nVar2)) {
      pool_local = (ngx_pool_t *)0xfffffffffffffffb;
    }
    else {
      pool_local = (ngx_pool_t *)ngx_parse_addr(pool,addr,(u_char *)len_local,(long)p - (n + 1));
      if (pool_local == (ngx_pool_t *)0x0) {
        ngx_inet_set_port(addr->sockaddr,(in_port_t)nVar2);
        pool_local = (ngx_pool_t *)0x0;
      }
    }
  }
  return (ngx_int_t)pool_local;
}

Assistant:

ngx_int_t
ngx_parse_addr_port(ngx_pool_t *pool, ngx_addr_t *addr, u_char *text,
    size_t len)
{
    u_char     *p, *last;
    size_t      plen;
    ngx_int_t   rc, port;

    rc = ngx_parse_addr(pool, addr, text, len);

    if (rc != NGX_DECLINED) {
        return rc;
    }

    last = text + len;

#if (NGX_HAVE_INET6)
    if (len && text[0] == '[') {

        p = ngx_strlchr(text, last, ']');

        if (p == NULL || p == last - 1 || *++p != ':') {
            return NGX_DECLINED;
        }

        text++;
        len -= 2;

    } else
#endif

    {
        p = ngx_strlchr(text, last, ':');

        if (p == NULL) {
            return NGX_DECLINED;
        }
    }

    p++;
    plen = last - p;

    port = ngx_atoi(p, plen);

    if (port < 1 || port > 65535) {
        return NGX_DECLINED;
    }

    len -= plen + 1;

    rc = ngx_parse_addr(pool, addr, text, len);

    if (rc != NGX_OK) {
        return rc;
    }

    ngx_inet_set_port(addr->sockaddr, (in_port_t) port);

    return NGX_OK;
}